

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_expression_move.hpp
# Opt level: O0

size_t __thiscall optimization::global_expr_move::hasher::operator()(hasher *this,Op *p)

{
  char *pcVar1;
  uint32_t *puVar2;
  VarId *pVVar3;
  size_t sVar4;
  size_t sVar5;
  int in_EDX;
  int extraout_EDX;
  int extraout_EDX_00;
  int __c;
  char *in_RSI;
  int rhs;
  int lhs;
  uint32_t local_24;
  uint32_t local_20;
  hash<int> local_1a;
  hash<int> local_19;
  uint32_t local_18;
  uint32_t local_14;
  char *local_10;
  
  local_10 = in_RSI;
  pcVar1 = std::variant<int,_mir::inst::VarId>::index
                     ((variant<int,_mir::inst::VarId> *)(in_RSI + 0x10),in_RSI,in_EDX);
  if (pcVar1 == (char *)0x0) {
    puVar2 = (uint32_t *)
             std::get<int,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x184a38);
    local_20 = *puVar2;
    __c = extraout_EDX;
  }
  else {
    pVVar3 = std::get<mir::inst::VarId,int,mir::inst::VarId>
                       ((variant<int,_mir::inst::VarId> *)0x184a52);
    local_20 = pVVar3->id;
    __c = extraout_EDX_00;
  }
  local_14 = local_20;
  pcVar1 = std::variant<int,_mir::inst::VarId>::index
                     ((variant<int,_mir::inst::VarId> *)(local_10 + 0x30),in_RSI,__c);
  if (pcVar1 == (char *)0x0) {
    puVar2 = (uint32_t *)
             std::get<int,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x184a8b);
    local_24 = *puVar2;
  }
  else {
    pVVar3 = std::get<mir::inst::VarId,int,mir::inst::VarId>
                       ((variant<int,_mir::inst::VarId> *)0x184aa5);
    local_24 = pVVar3->id;
  }
  local_18 = local_24;
  sVar4 = std::hash<int>::operator()(&local_19,local_14);
  sVar5 = std::hash<int>::operator()(&local_1a,local_18);
  return sVar4 ^ sVar5;
}

Assistant:

size_t operator()(const Op& p) const {
    int lhs = p.lhs.index() == 0 ? std::get<int>(p.lhs)
                                 : std::get<mir::inst::VarId>(p.lhs).id;
    int rhs = p.rhs.index() == 0 ? std::get<int>(p.rhs)
                                 : std::get<mir::inst::VarId>(p.rhs).id;

    return std::hash<int>()(lhs) ^ std::hash<int>()(rhs);
  }